

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O1

ktx_error_code_e
ktxTexture2_inflateZstdInt
          (ktxTexture2 *This,ktx_uint8_t *pDeflatedData,ktx_uint8_t *pInflatedData,
          ktx_size_t inflatedDataCapacity)

{
  ktxTexture2_private *pkVar1;
  bool bVar2;
  ktx_uint32_t kVar3;
  uint uVar4;
  ZSTD_ErrorCode ZVar5;
  void *__src;
  ZSTD_DCtx *dctx;
  ulong uVar6;
  size_t code;
  int iVar7;
  ktxLevelIndexEntry *__dest;
  ktx_error_code_e kVar8;
  ulong __size;
  ktx_uint32_t kVar9;
  undefined1 auVar10 [16];
  long local_70;
  ktx_size_t local_60;
  size_t local_48;
  
  kVar8 = KTX_INVALID_VALUE;
  if ((pInflatedData != (ktx_uint8_t *)0x0 && pDeflatedData != (ktx_uint8_t *)0x0) &&
     (kVar8 = KTX_INVALID_OPERATION, This->supercompressionScheme == KTX_SS_ZSTD)) {
    pkVar1 = This->_private;
    __size = (ulong)(This->numLevels * 0x18);
    __src = malloc(__size);
    if (__src == (void *)0x0) {
      kVar8 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar3 = ktxTexture2_calcPostInflationLevelAlignment(This);
      dctx = ZSTD_createDCtx();
      if (dctx == (ZSTD_DCtx *)0x0) {
        kVar8 = KTX_OUT_OF_MEMORY;
      }
      else {
        __dest = pkVar1->_levelIndex;
        kVar9 = This->numLevels;
        kVar8 = KTX_SUCCESS;
        local_60 = 0;
        local_70 = 0;
        local_48 = inflatedDataCapacity;
        do {
          kVar9 = kVar9 - 1;
          if ((int)kVar9 < 0) {
            iVar7 = 3;
            break;
          }
          uVar6 = (ulong)(kVar9 & 0x7fffffff);
          code = ZSTD_decompressDCtx(dctx,pInflatedData + local_70,local_48,
                                     pDeflatedData + __dest[uVar6].byteOffset,
                                     pkVar1->_levelIndex[uVar6].byteLength);
          uVar4 = ZSTD_isError(code);
          if (uVar4 == 0) {
            if (This->_private->_levelIndex[uVar6].uncompressedByteLength != code)
            goto LAB_001f18bb;
            *(long *)((long)__src + uVar6 * 0x18) = local_70;
            *(size_t *)((long)__src + uVar6 * 0x18 + 8) = code;
            *(size_t *)((long)__src + uVar6 * 0x18 + 0x10) = code;
            auVar10 = ZEXT416((uint)((float)code / (float)kVar3));
            auVar10 = roundss(auVar10,auVar10,10);
            uVar6 = (long)(auVar10._0_4_ * (float)kVar3) & 0xffffffff;
            local_60 = local_60 + uVar6;
            local_70 = local_70 + uVar6;
            local_48 = local_48 - uVar6;
            iVar7 = 0;
            bVar2 = true;
          }
          else {
            ZVar5 = ZSTD_getErrorCode(code);
            if (ZVar5 == ZSTD_error_dstSize_tooSmall) {
LAB_001f18bb:
              kVar8 = KTX_DECOMPRESS_LENGTH_ERROR;
            }
            else if (ZVar5 == ZSTD_error_memory_allocation) {
              kVar8 = KTX_OUT_OF_MEMORY;
            }
            else if (ZVar5 == ZSTD_error_checksum_wrong) {
              kVar8 = KTX_DECOMPRESS_CHECKSUM_ERROR;
            }
            else {
              kVar8 = KTX_FILE_DATA_ERROR;
            }
            iVar7 = 2;
            bVar2 = false;
          }
        } while (bVar2);
        if (iVar7 != 2) {
          if (iVar7 != 3) {
            return kVar8;
          }
          This->dataSize = local_60;
          This->supercompressionScheme = KTX_SS_BEGIN_RANGE;
          memcpy(__dest,__src,__size);
          This->_private->_requiredLevelAlignment = kVar3;
        }
      }
      ZSTD_freeDCtx(dctx);
      free(__src);
    }
  }
  return kVar8;
}

Assistant:

KTX_error_code
ktxTexture2_inflateZstdInt(ktxTexture2* This, ktx_uint8_t* pDeflatedData,
                           ktx_uint8_t* pInflatedData,
                           ktx_size_t inflatedDataCapacity)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    uint64_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex = NULL;
    ktx_uint32_t uncompressedLevelAlignment;
    ktx_error_code_e result = KTX_SUCCESS;

    ZSTD_DCtx* dctx = NULL;

    if (pDeflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (pInflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (This->supercompressionScheme != KTX_SS_ZSTD)
        return KTX_INVALID_OPERATION;

    nindex = malloc(levelIndexByteLength);
    if (nindex == NULL)
        return KTX_OUT_OF_MEMORY;

    uncompressedLevelAlignment =
        ktxTexture2_calcPostInflationLevelAlignment(This);

    ktx_size_t inflatedByteLength = 0;
    dctx = ZSTD_createDCtx();
    if (dctx == NULL) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLength =
            ZSTD_decompressDCtx(dctx, pInflatedData + levelOffset,
                              inflatedDataCapacity,
                              &pDeflatedData[cindex[level].byteOffset],
                              cindex[level].byteLength);
        if (ZSTD_isError(levelByteLength)) {
            ZSTD_ErrorCode error = ZSTD_getErrorCode(levelByteLength);
            switch(error) {
              case ZSTD_error_dstSize_tooSmall:
                result = KTX_DECOMPRESS_LENGTH_ERROR; // inflatedDataCapacity too small.
                goto cleanup;
              case ZSTD_error_checksum_wrong:
                result = KTX_DECOMPRESS_CHECKSUM_ERROR;
                goto cleanup;
              case ZSTD_error_memory_allocation:
                result =  KTX_OUT_OF_MEMORY;
                goto cleanup;
             default:
                result = KTX_FILE_DATA_ERROR;
                goto cleanup;
            }
        }

        if (This->_private->_levelIndex[level].uncompressedByteLength != levelByteLength) {
            result = KTX_DECOMPRESS_LENGTH_ERROR;
            goto cleanup;
        }

        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = nindex[level].byteLength =
                                                            levelByteLength;
        ktx_size_t paddedLevelByteLength
              = _KTX_PADN(uncompressedLevelAlignment, levelByteLength);
        inflatedByteLength += paddedLevelByteLength;
        levelOffset += paddedLevelByteLength;
        inflatedDataCapacity -= paddedLevelByteLength;
    }

    // Now modify the texture.

    This->dataSize = inflatedByteLength;
    This->supercompressionScheme = KTX_SS_NONE;
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    This->_private->_requiredLevelAlignment = uncompressedLevelAlignment;

cleanup:
    ZSTD_freeDCtx(dctx);
    free(nindex);
    return result;
}